

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.hpp
# Opt level: O0

string * __thiscall OpenMD::GB::getName_abi_cxx11_(GB *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x10));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }